

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O2

Result wabt::ReadBinary(void *data,size_t size,BinaryReaderDelegate *delegate,
                       ReadBinaryOptions *options)

{
  Result RVar1;
  int iVar2;
  Enum EVar3;
  char *format;
  uint32_t local_110;
  uint32_t magic;
  BinaryReader reader;
  
  reader.state_.offset = 0;
  reader.read_end_ = size;
  reader.state_.data = (uint8_t *)data;
  reader.state_.size = size;
  BinaryReaderLogging::BinaryReaderLogging(&reader.logging_delegate_,options->log_stream,delegate);
  reader.delegate_ = &reader.logging_delegate_.super_BinaryReaderDelegate;
  if (options->log_stream == (Stream *)0x0) {
    reader.delegate_ = delegate;
  }
  reader.param_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  reader.param_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  reader.param_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  reader.result_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  reader.result_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  reader.result_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  reader.fields_.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  reader.fields_.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  reader.fields_.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  reader.target_depths_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  reader.target_depths_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  reader.target_depths_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  reader.last_known_section_ = Invalid;
  reader.did_read_names_section_ = false;
  reader.reading_custom_section_ = false;
  reader.num_func_imports_ = 0;
  reader.num_table_imports_ = 0;
  reader.num_memory_imports_ = 0;
  reader.num_global_imports_ = 0;
  reader.num_event_imports_ = 0;
  reader.num_function_signatures_ = 0;
  reader.num_function_bodies_ = 0;
  reader.data_count_ = 0xffffffff;
  reader.options_ = options;
  (*delegate->_vptr_BinaryReaderDelegate[3])(delegate,&reader.state_);
  magic = 0;
  RVar1 = anon_unknown_24::BinaryReader::ReadU32(&reader,&magic,"magic");
  EVar3 = Error;
  if (RVar1.enum_ == Error) goto LAB_001c34b8;
  if (magic == 0x6d736100) {
    local_110 = 0;
    RVar1 = anon_unknown_24::BinaryReader::ReadU32(&reader,&local_110,"version");
    if (RVar1.enum_ == Error) {
      EVar3 = Error;
      goto LAB_001c34b8;
    }
    if (local_110 != 1) {
      EVar3 = Error;
      anon_unknown_24::BinaryReader::PrintError
                (&reader,"bad wasm file version: %#x (expected %#x)",(ulong)local_110,1);
      goto LAB_001c34b8;
    }
    EVar3 = Error;
    iVar2 = (*(reader.delegate_)->_vptr_BinaryReaderDelegate[4])(reader.delegate_,1);
    if (iVar2 == 0) {
      RVar1 = anon_unknown_24::BinaryReader::ReadSections(&reader);
      if (RVar1.enum_ == Error) goto LAB_001c34b8;
      if (reader.num_function_signatures_ == reader.num_function_bodies_) {
        iVar2 = (*(reader.delegate_)->_vptr_BinaryReaderDelegate[5])();
        if (iVar2 == 0) {
          EVar3 = Ok;
          goto LAB_001c34b8;
        }
        format = "EndModule callback failed";
      }
      else {
        format = "function signature count != function body count";
      }
    }
    else {
      format = "BeginModule callback failed";
    }
  }
  else {
    format = "bad magic value";
  }
  EVar3 = Error;
  anon_unknown_24::BinaryReader::PrintError(&reader,format);
LAB_001c34b8:
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&reader.target_depths_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
  ;
  std::_Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>::~_Vector_base
            (&reader.fields_.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
            (&reader.result_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
            (&reader.param_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>);
  return (Result)EVar3;
}

Assistant:

BinaryReader::BinaryReader(const void* data,
                           size_t size,
                           BinaryReaderDelegate* delegate,
                           const ReadBinaryOptions& options)
    : read_end_(size),
      state_(static_cast<const uint8_t*>(data), size),
      logging_delegate_(options.log_stream, delegate),
      delegate_(options.log_stream ? &logging_delegate_ : delegate),
      options_(options),
      last_known_section_(BinarySection::Invalid) {
  delegate->OnSetState(&state_);
}